

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall FfsParser::parseSignedPackageInfoData(FfsParser *this,UModelIndex *index)

{
  uchar **ppuVar1;
  char cVar2;
  TreeModel *this_00;
  _Alloc_hider _Var3;
  uint offset;
  USTATUS UVar4;
  char *pcVar5;
  pointer pcVar6;
  uint uVar7;
  pointer pcVar8;
  UByteArray local_140;
  FfsParser *local_120;
  UByteArray hash;
  UByteArray module;
  CBString local_d0;
  CBString name;
  UByteArray body;
  CBString local_78;
  CBString info;
  UModelIndex local_48;
  
  UVar4 = 1;
  if (((-1 < index->r) && (-1 < index->c)) && (index->m != (TreeModel *)0x0)) {
    local_120 = this;
    TreeModel::body(&body,this->model,index);
    ppuVar1 = &local_d0.super_tagbstring.data;
    offset = 0;
    do {
      uVar7 = (uint)body.d._M_string_length - offset;
      if ((uint)body.d._M_string_length <= offset) break;
      if (0x13 < uVar7) {
        pcVar8 = body.d._M_dataplus._M_p + offset;
        module.d._M_dataplus._M_p = (pointer)&module.d.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&module,pcVar8,pcVar8 + (ulong)*(ushort *)(pcVar8 + 0xe) + 0x14);
        usprintf(&name,"%.12s",pcVar8);
        hash.d._M_dataplus._M_p = (pointer)&hash.d.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&hash,pcVar8 + 0x14,pcVar8 + (ulong)*(ushort *)(pcVar8 + 0xe) + 0x14);
        pcVar6 = hash.d._M_dataplus._M_p + (hash.d._M_string_length - 1);
        _Var3._M_p = hash.d._M_dataplus._M_p;
        if (hash.d._M_dataplus._M_p < pcVar6 && hash.d._M_string_length != 0) {
          do {
            pcVar5 = _Var3._M_p + 1;
            cVar2 = *_Var3._M_p;
            *_Var3._M_p = *pcVar6;
            *pcVar6 = cVar2;
            pcVar6 = pcVar6 + -1;
            _Var3._M_p = pcVar5;
          } while (pcVar5 < pcVar6);
        }
        usprintf(&local_d0,
                 "Full size: %Xh (%u)\nType: %Xh\nHash algorithm: %Xh\nHash size: %Xh (%u)\nMetadata size: %Xh (%u)\nMetadata hash: "
                 ,(ulong)(uint)module.d._M_string_length,(ulong)(uint)module.d._M_string_length,
                 (ulong)(byte)pcVar8[0xc],(ulong)(byte)pcVar8[0xd],(ulong)*(ushort *)(pcVar8 + 0xe),
                 (ulong)*(ushort *)(pcVar8 + 0xe),(ulong)*(uint *)(pcVar8 + 0x10),
                 (ulong)*(uint *)(pcVar8 + 0x10));
        UByteArray::toHex(&local_140,&hash);
        Bstrlib::CBString::CBString(&local_78,local_140.d._M_dataplus._M_p);
        Bstrlib::CBString::operator+(&info,&local_d0,&local_78);
        Bstrlib::CBString::~CBString(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.d._M_dataplus._M_p != &local_140.d.field_2) {
          operator_delete(local_140.d._M_dataplus._M_p);
        }
        Bstrlib::CBString::~CBString(&local_d0);
        this_00 = local_120->model;
        Bstrlib::CBString::CBString(&local_78);
        local_140.d._M_dataplus._M_p = (pointer)&local_140.d.field_2;
        local_140.d._M_string_length = 0;
        local_140.d.field_2._M_local_buf[0] = '\0';
        local_d0.super_tagbstring.mlen = 0;
        local_d0.super_tagbstring.slen = 0;
        local_d0.super_tagbstring.data._0_1_ = 0;
        local_d0._vptr_CBString = (_func_int **)ppuVar1;
        TreeModel::addItem(&local_48,this_00,offset,'c','\0',&name,&local_78,&info,&local_140,
                           &module,(UByteArray *)&local_d0,Fixed,index,'\0');
        if (local_d0._vptr_CBString != (_func_int **)ppuVar1) {
          operator_delete(local_d0._vptr_CBString);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.d._M_dataplus._M_p != &local_140.d.field_2) {
          operator_delete(local_140.d._M_dataplus._M_p);
        }
        Bstrlib::CBString::~CBString(&local_78);
        offset = offset + (uint)module.d._M_string_length;
        Bstrlib::CBString::~CBString(&info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)hash.d._M_dataplus._M_p != &hash.d.field_2) {
          operator_delete(hash.d._M_dataplus._M_p);
        }
        Bstrlib::CBString::~CBString(&name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)module.d._M_dataplus._M_p != &module.d.field_2) {
          operator_delete(module.d._M_dataplus._M_p);
        }
      }
    } while (0x13 < uVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)body.d._M_dataplus._M_p != &body.d.field_2) {
      operator_delete(body.d._M_dataplus._M_p);
    }
    UVar4 = 0;
  }
  return UVar4;
}

Assistant:

USTATUS FfsParser::parseSignedPackageInfoData(const UModelIndex & index)
{
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    UByteArray body = model->body(index);
    UINT32 offset = 0;
    while (offset < (UINT32)body.size()) {
        const CPD_EXT_SIGNED_PACKAGE_INFO_MODULE* moduleHeader = (const CPD_EXT_SIGNED_PACKAGE_INFO_MODULE*)(body.constData() + offset);
        if (sizeof(CPD_EXT_SIGNED_PACKAGE_INFO_MODULE) <= ((UINT32)body.size() - offset)) {
            // TODO: check sanity of moduleHeader->HashSize
            UByteArray module((const char*)moduleHeader, CpdExtSignedPkgMetadataHashOffset + moduleHeader->HashSize);
            UString name = usprintf("%.12s", moduleHeader->Name);
            
            // This hash is stored reversed
            // Need to reverse it back to normal
            UByteArray hash((const char*)moduleHeader + CpdExtSignedPkgMetadataHashOffset, moduleHeader->HashSize);
            std::reverse(hash.begin(), hash.end());
            
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh\nHash algorithm: %Xh\nHash size: %Xh (%u)\nMetadata size: %Xh (%u)\nMetadata hash: ",
                                    (UINT32)module.size(), (UINT32)module.size(),
                                    moduleHeader->Type,
                                    moduleHeader->HashAlgorithm,
                                    moduleHeader->HashSize, moduleHeader->HashSize,
                                    moduleHeader->MetadataSize, moduleHeader->MetadataSize) + UString(hash.toHex().constData());
            // Add tree otem
            model->addItem(offset, Types::CpdSpiEntry, 0, name, UString(), info, UByteArray(), module, UByteArray(), Fixed, index);
            offset += module.size();
        }
        else break;
        // TODO: add padding at the end
    }
    
    return U_SUCCESS;
}